

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_get_num_events(event_base *base,uint type)

{
  int local_18;
  int r;
  uint type_local;
  event_base *base_local;
  
  local_18 = 0;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if ((type & 1) != 0) {
    local_18 = base->event_count_active;
  }
  if ((type & 2) != 0) {
    local_18 = base->virtual_event_count + local_18;
  }
  if ((type & 4) != 0) {
    local_18 = base->event_count + local_18;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return local_18;
}

Assistant:

int
event_base_get_num_events(struct event_base *base, unsigned int type)
{
	int r = 0;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (type & EVENT_BASE_COUNT_ACTIVE)
		r += base->event_count_active;

	if (type & EVENT_BASE_COUNT_VIRTUAL)
		r += base->virtual_event_count;

	if (type & EVENT_BASE_COUNT_ADDED)
		r += base->event_count;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	return r;
}